

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O1

void ScaKwdHdr(GmfMshSct *msh,int KwdCod)

{
  int *piVar1;
  char *__s2;
  int iVar2;
  int iVar3;
  size_t sVar4;
  long lVar5;
  int *piVar6;
  char *(*papcVar7) [3];
  int local_40;
  int local_3c;
  char *(*local_38) [3];
  
  iVar2 = strcmp("i",GmfKwdFmt[KwdCod][1]);
  if (iVar2 == 0) {
    if ((msh->typ & 1) == 0) {
      if (msh->ver < 4) {
        ScaWrd(msh,&local_40);
        msh->KwdTab[KwdCod].NmbLin = (long)local_40;
      }
      else {
        ScaDblWrd(msh,&msh->KwdTab[KwdCod].NmbLin);
      }
    }
    else {
      iVar2 = __isoc99_fscanf(msh->hdl,"%ld",&msh->KwdTab[KwdCod].NmbLin);
      if (iVar2 != 1) goto LAB_0010bc85;
    }
  }
  else {
    msh->KwdTab[KwdCod].NmbLin = 1;
  }
  papcVar7 = GmfKwdFmt + KwdCod;
  __s2 = GmfKwdFmt[KwdCod][2];
  iVar3 = strcmp("sr",__s2);
  iVar2 = KwdCod;
  if ((iVar3 == 0) || (iVar3 = strcmp("hr",__s2), iVar3 == 0)) {
    if ((msh->typ & 1) == 0) {
      piVar1 = &msh->KwdTab[KwdCod].NmbTyp;
      ScaWrd(msh,piVar1);
      if (msh->KwdTab[KwdCod].NmbTyp < 1) {
        lVar5 = 0;
      }
      else {
        piVar6 = msh->KwdTab[KwdCod].TypTab;
        lVar5 = 0;
        local_38 = papcVar7;
        do {
          ScaWrd(msh,piVar6);
          lVar5 = lVar5 + 1;
          piVar6 = piVar6 + 1;
          papcVar7 = local_38;
        } while (lVar5 < *piVar1);
      }
      local_40 = (int)lVar5;
      iVar3 = strcmp("hr",(*papcVar7)[2]);
      piVar1 = &msh->KwdTab[KwdCod].deg;
      piVar6 = &msh->KwdTab[KwdCod].NmbNod;
      if (iVar3 == 0) {
        ScaWrd(msh,piVar1);
        ScaWrd(msh,piVar6);
      }
      else {
        *piVar1 = 0;
        *piVar6 = 1;
      }
    }
    else {
      piVar1 = &msh->KwdTab[KwdCod].NmbTyp;
      lVar5 = 0;
      local_3c = KwdCod;
      iVar2 = __isoc99_fscanf(msh->hdl,"%d",piVar1);
      if (iVar2 != 1) {
LAB_0010bc85:
        longjmp((__jmp_buf_tag *)msh->err,-1);
      }
      if (0 < *piVar1) {
        piVar6 = msh->KwdTab[KwdCod].TypTab;
        lVar5 = 0;
        local_38 = papcVar7;
        do {
          iVar2 = __isoc99_fscanf(msh->hdl,"%d",piVar6);
          if (iVar2 != 1) {
            local_40 = (int)lVar5;
            goto LAB_0010bc85;
          }
          lVar5 = lVar5 + 1;
          piVar6 = piVar6 + 1;
          papcVar7 = local_38;
        } while (lVar5 < *piVar1);
      }
      local_40 = (int)lVar5;
      iVar2 = strcmp("hr",(*papcVar7)[2]);
      if (iVar2 == 0) {
        iVar3 = __isoc99_fscanf(msh->hdl,"%d",&msh->KwdTab[KwdCod].deg);
        iVar2 = local_3c;
        if ((iVar3 != 1) ||
           (iVar3 = __isoc99_fscanf(msh->hdl,"%d",&msh->KwdTab[KwdCod].NmbNod), iVar3 != 1))
        goto LAB_0010bc85;
      }
      else {
        msh->KwdTab[KwdCod].deg = 0;
        msh->KwdTab[KwdCod].NmbNod = 1;
        iVar2 = local_3c;
      }
    }
  }
  ExpFmt(msh,iVar2);
  sVar4 = ftell((FILE *)msh->hdl);
  msh->KwdTab[KwdCod].pos = sVar4;
  return;
}

Assistant:

static void ScaKwdHdr(GmfMshSct *msh, int KwdCod)
{
   int      i;
   KwdSct   *kwd = &msh->KwdTab[ KwdCod ];

   if(!strcmp("i", GmfKwdFmt[ KwdCod ][1]))
      if(msh->typ & Asc)
         safe_fscanf(msh->hdl, INT64_T_FMT, &kwd->NmbLin, msh->err);
      else
         if(msh->ver <= 3)
         {
            ScaWrd(msh, (unsigned char *)&i);
            kwd->NmbLin = i;
         }
         else
            ScaDblWrd(msh, (unsigned char *)&kwd->NmbLin);
   else
      kwd->NmbLin = 1;

   if(!strcmp("sr", GmfKwdFmt[ KwdCod ][2])
   || !strcmp("hr", GmfKwdFmt[ KwdCod ][2]) )
   {
      if(msh->typ & Asc)
      {
         safe_fscanf(msh->hdl, "%d", &kwd->NmbTyp, msh->err);

         for(i=0;i<kwd->NmbTyp;i++)
            safe_fscanf(msh->hdl, "%d", &kwd->TypTab[i], msh->err);

         // Scan two extra fields for HO solutions: deg and nmb Nodes
         if(!strcmp("hr", GmfKwdFmt[ KwdCod ][2]))
         {
            safe_fscanf(msh->hdl, "%d", &kwd->deg, msh->err);
            safe_fscanf(msh->hdl, "%d", &kwd->NmbNod, msh->err);
         }
         else
         {
            kwd->deg = 0;
            kwd->NmbNod = 1;
         }

      }
      else
      {
         ScaWrd(msh, (unsigned char *)&kwd->NmbTyp);

         for(i=0;i<kwd->NmbTyp;i++)
            ScaWrd(msh, (unsigned char *)&kwd->TypTab[i]);

         // Scan two extra fields for HO solutions: deg and nmb Nodes
         if(!strcmp("hr", GmfKwdFmt[ KwdCod ][2]))
         {
            ScaWrd(msh, (unsigned char *)&kwd->deg);
            ScaWrd(msh, (unsigned char *)&kwd->NmbNod);
         }
         else
         {
            kwd->deg = 0;
            kwd->NmbNod = 1;
         }
      }
   }

   ExpFmt(msh, KwdCod);
   kwd->pos = GetFilPos(msh);
}